

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

IRet * __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::GetComponent<tcu::Vector<float,_4>_>::doApply
          (IRet *__return_storage_ptr__,GetComponent<tcu::Vector<float,_4>_> *this,
          EvalContext *param_1,IArgs *iargs)

{
  uint uVar1;
  double *pdVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  
  pdVar2 = &iargs->a->m_data[0].m_lo;
  dVar7 = INFINITY;
  dVar8 = -INFINITY;
  lVar3 = 0;
  uVar4 = 0;
  do {
    if ((iargs->b->m_lo <= (double)(int)lVar3) && ((double)(int)lVar3 <= iargs->b->m_hi)) {
      uVar1 = uVar4 & 1;
      uVar4 = 1;
      if (uVar1 == 0) {
        uVar4 = *(uint *)(pdVar2 + -1);
      }
      uVar5 = -(ulong)(dVar7 <= *pdVar2);
      uVar6 = -(ulong)(pdVar2[1] <= dVar8);
      dVar7 = (double)((ulong)dVar7 & uVar5 | ~uVar5 & (ulong)*pdVar2);
      dVar8 = (double)((ulong)dVar8 & uVar6 | ~uVar6 & (ulong)pdVar2[1]);
    }
    lVar3 = lVar3 + 1;
    pdVar2 = pdVar2 + 3;
  } while (lVar3 != 4);
  __return_storage_ptr__->m_hasNaN = SUB41(uVar4,0);
  __return_storage_ptr__->m_lo = dVar7;
  __return_storage_ptr__->m_hi = dVar8;
  return __return_storage_ptr__;
}

Assistant:

IRet		doApply		(const EvalContext&,
							 const typename GetComponent::IArgs& iargs) const
	{
		IRet ret;

		for (int compNdx = 0; compNdx < T::SIZE; ++compNdx)
		{
			if (iargs.b.contains(compNdx))
				ret = unionIVal<typename T::Element>(ret, iargs.a[compNdx]);
		}

		return ret;
	}